

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPrecompileHeadersCommand.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_10678fb::TargetPrecompileHeadersImpl::HandleDirectContent
          (TargetPrecompileHeadersImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  string *baseDir;
  allocator<char> local_a1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  undefined1 local_88 [16];
  _Optional_payload_base<cmListFileBacktrace> local_78;
  string local_60;
  string local_40;
  
  baseDir = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                      ((this->super_cmTargetPropCommandBase).Makefile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"PRECOMPILE_HEADERS",&local_a1);
  ConvertToAbsoluteContent(&local_a0,content,baseDir);
  (*(this->super_cmTargetPropCommandBase)._vptr_cmTargetPropCommandBase[6])
            (&local_60,this,&local_a0);
  cmMakefile::GetBacktrace((cmMakefile *)local_88);
  local_78._M_payload._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_88._0_8_;
  local_78._M_payload._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)local_88._8_8_;
  local_88._0_8_ = (_Map_pointer)0x0;
  local_88._8_8_ = 0;
  local_78._M_engaged = true;
  cmTarget::AppendProperty(tgt,&local_40,&local_60,(optional<cmListFileBacktrace> *)&local_78,false)
  ;
  std::_Optional_payload_base<cmListFileBacktrace>::_M_reset(&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  std::__cxx11::string::~string((string *)&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  return true;
}

Assistant:

bool HandleDirectContent(cmTarget* tgt,
                           const std::vector<std::string>& content,
                           bool /*prepend*/, bool /*system*/) override
  {
    std::string const& base = this->Makefile->GetCurrentSourceDirectory();
    tgt->AppendProperty("PRECOMPILE_HEADERS",
                        this->Join(ConvertToAbsoluteContent(content, base)),
                        this->Makefile->GetBacktrace());
    return true;
  }